

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

Type __thiscall
ON_MeshParameters::GeometrySettingsType(ON_MeshParameters *this,bool bIgnoreSubDParameters)

{
  bool bVar1;
  Type TVar2;
  double dVar3;
  ON_SHA1_Hash mp_hash;
  ON_SHA1_Hash OStack_48;
  ON_SHA1_Hash local_34;
  
  GeometrySettingsHash(&local_34,this,bIgnoreSubDParameters);
  GeometrySettingsHash(&OStack_48,&DefaultMesh,bIgnoreSubDParameters);
  bVar1 = ::operator==(&local_34,&OStack_48);
  TVar2 = Default;
  if (!bVar1) {
    GeometrySettingsHash(&OStack_48,&FastRenderMesh,bIgnoreSubDParameters);
    bVar1 = ::operator==(&local_34,&OStack_48);
    TVar2 = FastRender;
    if (!bVar1) {
      GeometrySettingsHash(&OStack_48,&QualityRenderMesh,bIgnoreSubDParameters);
      bVar1 = ::operator==(&local_34,&OStack_48);
      TVar2 = QualityRender;
      if (!bVar1) {
        GeometrySettingsHash(&OStack_48,&DefaultAnalysisMesh,bIgnoreSubDParameters);
        bVar1 = ::operator==(&local_34,&OStack_48);
        TVar2 = DefaultAnalysis;
        if (!bVar1) {
          dVar3 = MeshDensity(this,false);
          TVar2 = Custom;
          if (dVar3 == this->m_relative_tolerance) {
            TVar2 = FromMeshDensity;
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

enum ON_MeshParameters::Type ON_MeshParameters::GeometrySettingsType(bool bIgnoreSubDParameters) const
{
  const ON_SHA1_Hash mp_hash = GeometrySettingsHash(bIgnoreSubDParameters);

  if ( mp_hash == ON_MeshParameters::DefaultMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::Default;
  if ( mp_hash == ON_MeshParameters::FastRenderMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::FastRender;
  if ( mp_hash == ON_MeshParameters::QualityRenderMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::QualityRender;
  if ( mp_hash == ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::DefaultAnalysis;

  const double mesh_density = MeshDensity();
  if (mesh_density == RelativeTolerance())
    return ON_MeshParameters::Type::FromMeshDensity;

  return ON_MeshParameters::Type::Custom;
}